

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

void __thiscall
djb::matrix::transform
          (matrix *this,vector<double,_std::allocator<double>_> *v,
          vector<double,_std::allocator<double>_> *out)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  const_reference pvVar4;
  reference pvVar5;
  int local_34;
  value_type_conflict1 vStack_30;
  int i;
  int local_24;
  vector<double,_std::allocator<double>_> *pvStack_20;
  int j;
  vector<double,_std::allocator<double>_> *out_local;
  vector<double,_std::allocator<double>_> *v_local;
  matrix *this_local;
  
  pvStack_20 = out;
  out_local = v;
  v_local = &this->mij;
  std::vector<double,_std::allocator<double>_>::resize(out,0);
  for (local_24 = 0; local_24 < this->size; local_24 = local_24 + 1) {
    vStack_30 = 0.0;
    std::vector<double,_std::allocator<double>_>::push_back(pvStack_20,&stack0xffffffffffffffd0);
    for (local_34 = 0; local_34 < this->size; local_34 = local_34 + 1) {
      pdVar3 = operator()(this,local_34,local_24);
      dVar1 = *pdVar3;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](out_local,(long)local_34);
      dVar2 = *pvVar4;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvStack_20,(long)local_24);
      *pvVar5 = dVar1 * dVar2 + *pvVar5;
    }
  }
  return;
}

Assistant:

void
matrix::transform(const std::vector<double> &v, std::vector<double> &out) const
{
	out.resize(0);

	for (int j = 0; j < size; ++j) {
		out.push_back(0);

		for (int i = 0; i < size; ++i) {
			out[j]+= (*this)(i, j) * v[i];
		}
	}
}